

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_variable * __thiscall pugi::xpath_variable_set::find(xpath_variable_set *this,char_t *name)

{
  xpath_variable *this_00;
  bool bVar1;
  uint uVar2;
  char_t *src;
  xpath_variable **ppxVar3;
  
  uVar2 = impl::anon_unknown_0::hash_string(name);
  ppxVar3 = this->_data + (uVar2 & 0x3f);
  while( true ) {
    this_00 = *ppxVar3;
    if (this_00 == (xpath_variable *)0x0) {
      return (xpath_variable *)0x0;
    }
    src = xpath_variable::name(this_00);
    bVar1 = impl::anon_unknown_0::strequal(src,name);
    if (bVar1) break;
    ppxVar3 = &this_00->_next;
  }
  return this_00;
}

Assistant:

PUGI__FN xpath_variable* xpath_variable_set::find(const char_t* name) const
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var;

		return 0;
	}